

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pbVar6;
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  *this_00;
  pointer pcVar7;
  WrapQuotes in_R8D;
  string_view sVar8;
  string_view str;
  string_view str_00;
  undefined1 auVar9 [16];
  string local_690;
  undefined1 local_670 [16];
  string local_660;
  allocator<char> local_639;
  string local_638;
  cmValue local_618;
  cmValue labels;
  string local_608;
  cmValue local_5e8;
  cmValue directoryLabels;
  string local_5d0;
  string local_5b0;
  cmStateDirectory local_590;
  undefined1 local_568 [8];
  string outP;
  cmStateSnapshot *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vec_t *__range1_1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_510;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_4f8;
  vec_t *children;
  unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *tester;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  *__range1;
  string *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_4a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includesList;
  string local_480;
  cmValue local_460;
  cmValue testIncludeFiles;
  string local_450;
  cmValue local_430;
  cmValue testIncludeFile;
  string local_420;
  string local_400 [8];
  string resourceSpecFile;
  cmStateDirectory local_3b8;
  undefined1 local_390 [8];
  cmGeneratedFileStream fout;
  cmStateDirectory local_f8;
  cmAlphaNum local_d0;
  undefined1 local_a0 [8];
  string file;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator<char> local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    return;
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_((string *)((long)&file.field_2 + 8),this->Makefile)
  ;
  cmStateSnapshot::GetDirectory(&local_f8,&(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_f8);
  cmAlphaNum::cmAlphaNum(&local_d0,psVar3);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,"/CTestTestfile.cmake");
  cmStrCat<>((string *)local_a0,&local_d0,(cmAlphaNum *)&fout.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_390,(string *)local_a0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_390,true);
  poVar4 = std::operator<<((ostream *)local_390,
                           "# CMake generated Testfile for \n# Source directory: ");
  cmStateSnapshot::GetDirectory(&local_3b8,&(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_3b8);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\n# Build directory: ");
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)((long)&resourceSpecFile.field_2 + 8),
             &(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                     ((cmStateDirectory *)((long)&resourceSpecFile.field_2 + 8));
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4,
                  "\n# \n# This file includes the relevant testing commands required for \n# testing this directory and lists subdirectories to be tested as well.\n"
                 );
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"CTEST_RESOURCE_SPEC_FILE",
             (allocator<char> *)((long)&testIncludeFile.Value + 7));
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_420);
  std::__cxx11::string::string(local_400,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFile.Value + 7));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_390,"set(CTEST_RESOURCE_SPEC_FILE \"");
    poVar4 = std::operator<<(poVar4,local_400);
    std::operator<<(poVar4,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"TEST_INCLUDE_FILE",
             (allocator<char> *)((long)&testIncludeFiles.Value + 7));
  local_430 = cmMakefile::GetProperty(pcVar1,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFiles.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_430);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)local_390,"include(\"");
    psVar3 = cmValue::operator*[abi_cxx11_(&local_430);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"TEST_INCLUDE_FILES",
             (allocator<char> *)
             ((long)&includesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_460 = cmMakefile::GetProperty(pcVar1,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_460);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_460);
    sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4a0,sVar8,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4a0);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4a0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar4 = std::operator<<((ostream *)local_390,"include(\"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      std::operator<<(poVar4,"\")\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4a0);
  }
  this_00 = cmMakefile::GetTestGenerators(this->Makefile);
  __end1 = std::
           vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ::begin(this_00);
  tester = (unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
           std::
           vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
                                     *)&tester), bVar2) {
    children = (vec_t *)__gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
                        ::operator*(&__end1);
    pcVar7 = std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>::operator->
                       ((unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        children);
    cmTestGenerator::Compute(pcVar7,this);
    pcVar7 = std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>::operator->
                       ((unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        children);
    cmScriptGenerator::Generate
              (&pcVar7->super_cmScriptGenerator,(ostream *)local_390,
               (string *)((long)&file.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&config.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range1_1,this->Makefile);
  cmStateSnapshot::GetChildren(&local_510,(cmStateSnapshot *)&__range1_1);
  local_4f8 = &local_510;
  __end1_1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(&local_510);
  i_1 = (cmStateSnapshot *)
        std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(&local_510);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                             *)&i_1), bVar2) {
    outP.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
         ::operator*(&__end1_1);
    cmStateSnapshot::GetDirectory(&local_590,(cmStateSnapshot *)outP.field_2._8_8_);
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_590);
    std::__cxx11::string::string((string *)local_568,(string *)psVar3);
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_5b0,&this->super_cmOutputConverter,(string *)local_568);
    std::__cxx11::string::operator=((string *)local_568,(string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_5b0);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_568);
    sVar8._M_len = auVar9._8_8_;
    directoryLabels.Value = auVar9._0_8_;
    sVar8._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_5d0,(cmOutputConverter *)directoryLabels.Value,sVar8,in_R8D);
    std::__cxx11::string::operator=((string *)local_568,(string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    poVar4 = std::operator<<((ostream *)local_390,"subdirs(");
    poVar4 = std::operator<<(poVar4,(string *)local_568);
    std::operator<<(poVar4,")\n");
    std::__cxx11::string::~string((string *)local_568);
    __gnu_cxx::
    __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&__end1_1);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"CMAKE_DIRECTORY_LABELS",
             (allocator<char> *)((long)&labels.Value + 7));
  local_5e8 = cmMakefile::GetDefinition(pcVar1,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)((long)&labels.Value + 7));
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"LABELS",&local_639);
  local_618 = cmMakefile::GetProperty(pcVar1,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  bVar2 = cmValue::operator_cast_to_bool(&local_618);
  if (!bVar2) {
    bVar2 = cmValue::operator_cast_to_bool(&local_5e8);
    if (!bVar2) goto LAB_001a3c48;
  }
  std::operator<<((ostream *)local_390,"set_directory_properties(PROPERTIES LABELS ");
  bVar2 = cmValue::operator_cast_to_bool(&local_618);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_618);
    local_670 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    str._M_len = local_670._8_8_;
    str._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_660,local_670._0_8_,str,in_R8D);
    std::operator<<((ostream *)local_390,(string *)&local_660);
    std::__cxx11::string::~string((string *)&local_660);
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_618);
  if (bVar2) {
    bVar2 = cmValue::operator_cast_to_bool(&local_5e8);
    if (bVar2) {
      std::operator<<((ostream *)local_390,";");
    }
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_5e8);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_5e8);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    str_00._M_len = auVar9._8_8_;
    str_00._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_690,auVar9._0_8_,str_00,in_R8D);
    std::operator<<((ostream *)local_390,(string *)&local_690);
    std::__cxx11::string::~string((string *)&local_690);
  }
  std::operator<<((ostream *)local_390,")\n");
LAB_001a3c48:
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_510);
  std::__cxx11::string::~string(local_400);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_390);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  std::string file =
    cmStrCat(this->StateSnapshot.GetDirectory().GetCurrentBinary(),
             "/CTestTestfile.cmake");

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for \n"
          "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n"
          "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << "\n"
          "# \n"
          "# This file includes the relevant testing commands "
          "required for \n"
          "# testing this directory and lists subdirectories to "
          "be tested as well.\n";

  std::string resourceSpecFile =
    this->Makefile->GetSafeDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (!resourceSpecFile.empty()) {
    fout << "set(CTEST_RESOURCE_SPEC_FILE \"" << resourceSpecFile << "\")\n";
  }

  cmValue testIncludeFile = this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << *testIncludeFile << "\")\n";
  }

  cmValue testIncludeFiles = this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList = cmExpandedList(*testIncludeFiles);
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")\n";
    }
  }

  // Ask each test generator to write its code.
  for (const auto& tester : this->Makefile->GetTestGenerators()) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  using vec_t = std::vector<cmStateSnapshot>;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeRelativeToCurBinDir(outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")\n";
  }

  // Add directory labels property
  cmValue directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  cmValue labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(*labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(*directoryLabels);
    }
    fout << ")\n";
  }
}